

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::emptyConstructorTest<true>(ViewTest *this)

{
  size_t sVar1;
  bool local_65 [20];
  allocator<int> local_51;
  undefined1 local_50 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  ViewTest *this_local;
  
  v.geometry_._48_8_ = this;
  std::allocator<int>::allocator(&local_51);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_50,&local_51);
  std::allocator<int>::~allocator(&local_51);
  sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_50);
  local_65[0] = sVar1 == 0;
  test(local_65);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_50);
  return;
}

Assistant:

void ViewTest::emptyConstructorTest() {
    andres::View<int, constTarget> v;   
    
    test(v.size() == 0
        );
}